

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DramAnalyzer.cpp
# Opt level: O1

size_t __thiscall DramAnalyzer::count_acts_per_trefi(DramAnalyzer *this)

{
  pointer *****ppppppuVar1;
  pointer pvVar2;
  pointer ppcVar3;
  pointer ppcVar4;
  char *pcVar5;
  char *pcVar6;
  iterator __begin2;
  pointer ******extraout_RAX;
  pointer ******pppppppuVar7;
  iterator __end2;
  ulong uVar8;
  ulong extraout_RDX;
  ulong uVar9;
  undefined8 uVar10;
  pointer unaff_R14;
  ulong uVar11;
  ulong uVar12;
  pointer unaff_R15;
  pointer pcVar13;
  bool bVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  string local_88;
  _Alloc_hider local_68;
  uint64_t value;
  undefined8 local_58;
  pointer ******pppppppuStack_48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> acts;
  
  pvVar2 = (this->banks).
           super__Vector_base<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>,_std::allocator<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->banks).
      super__Vector_base<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>,_std::allocator<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == pvVar2) {
    uVar8 = 0;
  }
  else {
    ppcVar3 = (pvVar2->super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    ppcVar4 = (pvVar2->super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    uVar8 = (long)ppcVar4 - (long)ppcVar3 >> 3;
    if (ppcVar4 != ppcVar3) {
      if (1 < uVar8) {
        pcVar5 = *ppcVar3;
        pcVar6 = ppcVar3[1];
        pppppppuStack_48 = (pointer ******)0x0;
        acts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        acts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        pcVar13 = (pointer)0x0;
        pppppppuVar7 = (pointer ******)&pppppppuStack_48;
        uVar11 = 0;
        do {
          do {
            do {
              local_68._M_p = (pointer)0x0;
              uVar9 = uVar11;
              do {
                uVar12 = uVar9;
                clflushopt(*pcVar5);
                clflushopt(*pcVar6);
                rdtscp();
                uVar9 = uVar8 << 0x20 | (ulong)pppppppuVar7;
                pppppppuVar7 = (pointer ******)CONCAT71((int7)((ulong)pppppppuVar7 >> 8),*pcVar6);
                rdtscp();
                uVar8 = (uVar8 << 0x20 | (ulong)pppppppuVar7) - uVar9;
                uVar9 = uVar12 + 1;
                local_68._M_p = local_68._M_p + 2;
              } while (uVar8 < 0x3e9);
              bVar14 = uVar11 == 0;
              pppppppuVar7 = (pointer ******)CONCAT71((int7)(uVar12 >> 8),0x32 < uVar12);
              uVar11 = uVar9;
            } while (bVar14 || 0x32 >= uVar12);
            if (acts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start ==
                acts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)&pppppppuStack_48,
                         (iterator)
                         acts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                         (unsigned_long *)&stack0xffffffffffffff98);
            }
            else {
              *acts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start = (unsigned_long)local_68._M_p;
              acts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start =
                   acts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
            }
            pcVar13 = pcVar13 + local_68._M_p;
            uVar8 = (long)acts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_start - (long)pppppppuStack_48 >> 3;
            pppppppuVar7 = pppppppuStack_48;
          } while (0x147ae147ae147ae <
                   (uVar8 * -0x70a3d70a3d70a3d7 >> 3 | uVar8 * -0x70a3d70a3d70a3d7 << 0x3d));
          auVar16._8_4_ =
               (int)((long)acts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_start - (long)pppppppuStack_48 >> 0x23
                    );
          auVar16._0_8_ = uVar8;
          auVar16._12_4_ = 0x45300000;
          dVar18 = (auVar16._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0);
          if (pppppppuStack_48 ==
              (pointer ******)
              acts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start) {
            dVar20 = 0.0;
          }
          else {
            auVar17._8_4_ = (int)((ulong)pcVar13 >> 0x20);
            auVar17._0_8_ = pcVar13;
            auVar17._12_4_ = 0x45300000;
            dVar19 = ((auVar17._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)pcVar13) - 4503599627370496.0)) / dVar18;
            dVar20 = 0.0;
            do {
              ppppppuVar1 = *pppppppuVar7;
              auVar22._8_4_ = (int)((ulong)ppppppuVar1 >> 0x20);
              auVar22._0_8_ = ppppppuVar1;
              auVar22._12_4_ = 0x45300000;
              dVar15 = (auVar22._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)ppppppuVar1) - 4503599627370496.0);
              dVar21 = dVar15 - dVar19;
              uVar9 = -(ulong)(dVar15 < dVar19);
              dVar20 = (double)(uVar9 & (ulong)dVar20 | ~uVar9 & (ulong)(dVar21 * dVar21 + dVar20));
              pppppppuVar7 = pppppppuVar7 + 1;
            } while (pppppppuVar7 !=
                     (pointer ******)
                     acts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start);
          }
          dVar20 = dVar20 / dVar18;
          if (dVar20 < 0.0) {
            dVar20 = sqrt(dVar20);
            pppppppuVar7 = extraout_RAX;
            uVar8 = extraout_RDX;
          }
          else {
            dVar20 = SQRT(dVar20);
          }
        } while (3.0 <= dVar20);
        uVar8 = (ulong)pcVar13 /
                (ulong)((long)acts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                              ._M_impl.super__Vector_impl_data._M_start - (long)pppppppuStack_48 >>
                       3);
        local_68._M_p = (pointer)&stack0xffffffffffffffa8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xffffffffffffff98,
                   "Determined the number of possible ACTs per refresh interval.","");
        Logger::log_info((string *)&stack0xffffffffffffff98,true);
        if (local_68._M_p != (pointer)&stack0xffffffffffffffa8) {
          operator_delete(local_68._M_p,local_58 + 1);
        }
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_88,"num_acts_per_tREFI: %lu","");
        format_string<unsigned_long>((string *)&stack0xffffffffffffff98,&local_88,uVar8);
        Logger::log_data((string *)&stack0xffffffffffffff98,true);
        if (local_68._M_p != (pointer)&stack0xffffffffffffffa8) {
          operator_delete(local_68._M_p,local_58 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        if (pppppppuStack_48 != (pointer ******)0x0) {
          operator_delete(pppppppuStack_48,
                          (long)acts.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)pppppppuStack_48);
        }
        return uVar8;
      }
      uVar10 = 1;
      goto LAB_0014648e;
    }
  }
  uVar10 = 0;
LAB_0014648e:
  uVar10 = std::__throw_out_of_range_fmt
                     ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                      uVar10,uVar8);
  if (local_68._M_p != unaff_R14) {
    operator_delete(local_68._M_p,local_58 + 1);
  }
  if (local_88._M_dataplus._M_p != unaff_R15) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (pppppppuStack_48 != (pointer ******)0x0) {
    operator_delete(pppppppuStack_48,
                    (long)acts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pppppppuStack_48);
  }
  _Unwind_Resume(uVar10);
}

Assistant:

size_t DramAnalyzer::count_acts_per_trefi() {
  size_t skip_first_N = 50;
  // pick two random same-bank addresses
  volatile char *a = banks.at(0).at(0);
  volatile char *b = banks.at(0).at(1);

  std::vector<uint64_t> acts;
  uint64_t running_sum = 0;
  uint64_t before;
  uint64_t after;
  uint64_t count = 0;
  uint64_t count_old = 0;

  // computes the standard deviation
  auto compute_std = [](std::vector<uint64_t> &values, uint64_t running_sum, size_t num_numbers) {
    double mean = static_cast<double>(running_sum)/static_cast<double>(num_numbers);
    double var = 0;
    for (const auto &num : values) {
      if (static_cast<double>(num) < mean) continue;
      var += std::pow(static_cast<double>(num) - mean, 2);
    }
    auto val = std::sqrt(var/static_cast<double>(num_numbers));
    return val;
  };

  for (size_t i = 0;; i++) {
    // flush a and b from caches
    clflushopt(a);
    clflushopt(b);
    mfence();

    // get start timestamp and wait until we retrieved it
    before = rdtscp();
    lfence();

    // do DRAM accesses
    (void)*a;
    (void)*b;

    // get end timestamp
    after = rdtscp();

    count++;
    if ((after - before) > 1000) {
      if (i > skip_first_N && count_old!=0) {
        // multiply by 2 to account for both accesses we do (a, b)
        uint64_t value = (count - count_old)*2;
        acts.push_back(value);
        running_sum += value;
        // check after each 200 data points if our standard deviation reached 1 -> then stop collecting measurements
        if ((acts.size()%200)==0 && compute_std(acts, running_sum, acts.size())<3.0) break;
      }
      count_old = count;
    }
  }

  auto activations = (running_sum/acts.size());
  Logger::log_info("Determined the number of possible ACTs per refresh interval.");
  Logger::log_data(format_string("num_acts_per_tREFI: %lu", activations));

  return activations;
}